

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O1

void randomx_calculate_hash_last(randomx_vm *machine,void *output)

{
  uint64_t *out;
  int iVar1;
  
  randomx_vm::resetRoundingMode(machine);
  out = machine->tempHash;
  iVar1 = 7;
  do {
    (*machine->_vptr_randomx_vm[8])(machine,out);
    randomx_blake2b(out,0x40,&machine->reg,0x100,(void *)0x0,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  (*machine->_vptr_randomx_vm[8])(machine,out);
  (*machine->_vptr_randomx_vm[3])(machine,output,0x20);
  return;
}

Assistant:

void randomx_calculate_hash_last(randomx_vm* machine, void* output) {
		machine->resetRoundingMode();
		for (int chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(machine->tempHash);
			blake2b(machine->tempHash, sizeof(machine->tempHash), machine->getRegisterFile(), sizeof(randomx::RegisterFile), nullptr, 0);
		}
		machine->run(machine->tempHash);
		machine->getFinalResult(output, RANDOMX_HASH_SIZE);
	}